

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_rand.c
# Opt level: O2

void evutil_secure_rng_get_bytes(void *buf,size_t n)

{
  int iVar1;
  bool bVar2;
  uchar uVar3;
  __pid_t _Var4;
  
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,arc4rand_lock);
  }
  _Var4 = getpid();
  if (((arc4_count < 1) || ((rs_initialized & 1) == 0)) || (arc4_stir_pid != _Var4)) {
    arc4_stir_pid = _Var4;
    arc4_stir();
  }
  while (n != 0) {
    iVar1 = arc4_count + -1;
    bVar2 = arc4_count < 2;
    arc4_count = iVar1;
    if (bVar2) {
      arc4_stir();
    }
    uVar3 = arc4_getbyte();
    *(uchar *)((long)buf + (n - 1)) = uVar3;
    n = n - 1;
  }
  if (arc4rand_lock == (void *)0x0) {
    return;
  }
  (*evthread_lock_fns_.unlock)(0,arc4rand_lock);
  return;
}

Assistant:

void
evutil_secure_rng_get_bytes(void *buf, size_t n)
{
	ev_arc4random_buf(buf, n);
}